

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O2

void sock_tests::SendAndRecvMessage(Sock *sender,Sock *receiver)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  char *pcVar4;
  int *piVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined4 local_10c;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  int local_d8;
  undefined4 uStack_d4;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  ssize_t msg_len;
  char recv_buf [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg_len = 4;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x61;
  file.m_begin = (iterator)&local_60;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_011480b0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_98 = "";
  recv_buf._0_4_ = (*sender->_vptr_Sock[3])(sender,"abcd",4,0);
  recv_buf._4_4_ = extraout_var;
  pcVar4 = recv_buf;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_90,&local_a0,0x61,1,2,pcVar4,"sender.Send(msg, msg_len, 0)",&msg_len,"msg_len");
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x62;
  file_00.m_begin = (iterator)&local_b0;
  msg_00.m_end = pcVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c0,msg_00
            );
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_011480b0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_c8 = "";
  local_d8 = (*receiver->_vptr_Sock[4])(receiver,recv_buf,10,0);
  piVar5 = &local_d8;
  pvVar3 = (iterator)0x2;
  uStack_d4 = extraout_var_00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_90,&local_d0,0x62,1,2,piVar5,"receiver.Recv(recv_buf, sizeof(recv_buf), 0)",
             &msg_len,"msg_len");
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x63;
  file_01.m_begin = (iterator)&local_e8;
  msg_01.m_end = (iterator)piVar5;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,msg_01
            );
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_011480b0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_100 = "";
  iVar2 = strncmp("abcd",recv_buf,4);
  _local_d8 = CONCAT44(uStack_d4,iVar2);
  local_10c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_90,&local_108,99,1,2,&local_d8,"strncmp(msg, recv_buf, msg_len)",&local_10c,"0")
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SendAndRecvMessage(const Sock& sender, const Sock& receiver)
{
    const char* msg = "abcd";
    constexpr ssize_t msg_len = 4;
    char recv_buf[10];

    BOOST_CHECK_EQUAL(sender.Send(msg, msg_len, 0), msg_len);
    BOOST_CHECK_EQUAL(receiver.Recv(recv_buf, sizeof(recv_buf), 0), msg_len);
    BOOST_CHECK_EQUAL(strncmp(msg, recv_buf, msg_len), 0);
}